

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O0

void logfopen(LogContext *ctx)

{
  _Bool _Var1;
  int iVar2;
  Filename *pFVar3;
  char *hostname;
  undefined1 local_88 [4];
  int logxfovr;
  int local_4c;
  undefined1 local_48 [4];
  int mode;
  tm tm;
  LogContext *ctx_local;
  
  if ((ctx->state == L_CLOSED) && (ctx->logtype != 0)) {
    tm.tm_zone = (char *)ctx;
    ltime();
    memcpy(local_48,local_88,0x38);
    if (*(long *)(tm.tm_zone + 0x38) != 0) {
      filename_free(*(Filename **)(tm.tm_zone + 0x38));
    }
    pFVar3 = conf_get_filename(*(Conf **)(tm.tm_zone + 0x48),0x81);
    hostname = conf_get_str(*(Conf **)(tm.tm_zone + 0x48),0);
    iVar2 = conf_get_int(*(Conf **)(tm.tm_zone + 0x48),1);
    pFVar3 = xlatlognam(pFVar3,hostname,iVar2,(tm *)local_48);
    *(Filename **)(tm.tm_zone + 0x38) = pFVar3;
    _Var1 = open_for_write_would_lose_data(*(Filename **)(tm.tm_zone + 0x38));
    if (_Var1) {
      iVar2 = conf_get_int(*(Conf **)(tm.tm_zone + 0x48),0x83);
      if (iVar2 == -1) {
        local_4c = lp_askappend(*(LogPolicy **)(tm.tm_zone + 0x40),*(Filename **)(tm.tm_zone + 0x38)
                                ,logfopen_callback,tm.tm_zone);
      }
      else {
        local_4c = 1;
        if (iVar2 == 1) {
          local_4c = 2;
        }
      }
    }
    else {
      local_4c = 2;
    }
    if (local_4c < 0) {
      tm.tm_zone[8] = '\x01';
      tm.tm_zone[9] = '\0';
      tm.tm_zone[10] = '\0';
      tm.tm_zone[0xb] = '\0';
    }
    else {
      logfopen_callback(tm.tm_zone,local_4c);
    }
  }
  return;
}

Assistant:

void logfopen(LogContext *ctx)
{
    struct tm tm;
    int mode;

    /* Prevent repeat calls */
    if (ctx->state != L_CLOSED)
        return;

    if (!ctx->logtype)
        return;

    tm = ltime();

    /* substitute special codes in file name */
    if (ctx->currlogfilename)
        filename_free(ctx->currlogfilename);
    ctx->currlogfilename =
        xlatlognam(conf_get_filename(ctx->conf, CONF_logfilename),
                   conf_get_str(ctx->conf, CONF_host),
                   conf_get_int(ctx->conf, CONF_port), &tm);

    if (open_for_write_would_lose_data(ctx->currlogfilename)) {
        int logxfovr = conf_get_int(ctx->conf, CONF_logxfovr);
        if (logxfovr != LGXF_ASK) {
            mode = ((logxfovr == LGXF_OVR) ? 2 : 1);
        } else
            mode = lp_askappend(ctx->lp, ctx->currlogfilename,
                                logfopen_callback, ctx);
    } else
        mode = 2;                      /* create == overwrite */

    if (mode < 0)
        ctx->state = L_OPENING;
    else
        logfopen_callback(ctx, mode);  /* open the file */
}